

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O3

bool __thiscall NaStateSpaceModel::Empty(NaStateSpaceModel *this)

{
  uint uVar1;
  NaMatrix *pNVar2;
  NaReal NVar3;
  
  pNVar2 = &this->A;
  uVar1 = NaMatrix::dim_rows(pNVar2);
  if ((uVar1 == 1) && (uVar1 = NaMatrix::dim_cols(pNVar2), uVar1 == 1)) {
    NVar3 = NaMatrix::get(pNVar2,0,0);
    if (NVar3 != 0.0) {
      return false;
    }
    if (NAN(NVar3)) {
      return false;
    }
    pNVar2 = &this->B;
    uVar1 = NaMatrix::dim_rows(pNVar2);
    if ((uVar1 == 1) && (uVar1 = NaMatrix::dim_cols(pNVar2), uVar1 == 1)) {
      NVar3 = NaMatrix::get(pNVar2,0,0);
      if (NVar3 != 0.0) {
        return false;
      }
      if (NAN(NVar3)) {
        return false;
      }
      pNVar2 = &this->C;
      uVar1 = NaMatrix::dim_rows(pNVar2);
      if ((uVar1 == 1) && (uVar1 = NaMatrix::dim_cols(pNVar2), uVar1 == 1)) {
        NVar3 = NaMatrix::get(pNVar2,0,0);
        if (NVar3 != 0.0) {
          return false;
        }
        if (NAN(NVar3)) {
          return false;
        }
        pNVar2 = &this->D;
        uVar1 = NaMatrix::dim_rows(pNVar2);
        if ((uVar1 == 1) && (uVar1 = NaMatrix::dim_cols(pNVar2), uVar1 == 1)) {
          NVar3 = NaMatrix::get(pNVar2,0,0);
          return (bool)(-(NVar3 == 0.0) & 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool
NaStateSpaceModel::Empty () const
{
    return (1 == A.dim_rows() && 1 == A.dim_cols() && 0.0 == A.get(0, 0) &&
	    1 == B.dim_rows() && 1 == B.dim_cols() && 0.0 == B.get(0, 0) &&
	    1 == C.dim_rows() && 1 == C.dim_cols() && 0.0 == C.get(0, 0) &&
	    1 == D.dim_rows() && 1 == D.dim_cols() && 0.0 == D.get(0, 0));
}